

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

void __thiscall OpenMD::RigidBody::setPrevA(RigidBody *this,RotMat3x3d *a)

{
  Atom *pAVar1;
  bool bVar2;
  double (*padVar3) [3];
  pointer ppAVar4;
  double *pdVar5;
  uint i;
  long lVar6;
  double (*padVar7) [3];
  long lVar8;
  double *pdVar9;
  uint j_1;
  uint k;
  long lVar10;
  ulong uVar11;
  double dVar12;
  SquareMatrix3<double> result;
  double local_c8 [10];
  double local_78 [10];
  
  padVar3 = (double (*) [3])
            ((long)(this->super_StuntDouble).localIndex_ * 0x48 +
            *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->previousSnapshot_->atomData)
                             .aMat.
                             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (this->super_StuntDouble).storage_));
  if ((RotMat3x3d *)padVar3 != a) {
    lVar6 = 0;
    padVar7 = (double (*) [3])a;
    do {
      lVar8 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar3)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar8] =
             (((SquareMatrix<double,_3> *)*padVar7)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar6 = lVar6 + 1;
      padVar3 = padVar3 + 1;
      padVar7 = padVar7 + 1;
    } while (lVar6 != 3);
  }
  ppAVar4 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar4) {
    uVar11 = 0;
    do {
      bVar2 = AtomType::isDirectional(ppAVar4[uVar11]->atomType_);
      if (bVar2) {
        padVar3 = (double (*) [3])
                  ((this->refOrients_).
                   super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11);
        pAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11];
        local_78[6] = 0.0;
        local_78[7] = 0.0;
        local_78[4] = 0.0;
        local_78[5] = 0.0;
        local_78[2] = 0.0;
        local_78[3] = 0.0;
        local_78[0] = 0.0;
        local_78[1] = 0.0;
        local_78[8] = 0.0;
        lVar6 = 0;
        pdVar5 = local_78;
        do {
          lVar8 = 0;
          pdVar9 = pdVar5;
          do {
            *pdVar9 = (((SquareMatrix<double,_3> *)*padVar3)->super_RectMatrix<double,_3U,_3U>).
                      data_[0][lVar8];
            lVar8 = lVar8 + 1;
            pdVar9 = pdVar9 + 3;
          } while (lVar8 != 3);
          lVar6 = lVar6 + 1;
          pdVar5 = pdVar5 + 1;
          padVar3 = padVar3 + 1;
        } while (lVar6 != 3);
        local_c8[6] = 0.0;
        local_c8[7] = 0.0;
        local_c8[4] = 0.0;
        local_c8[5] = 0.0;
        local_c8[2] = 0.0;
        local_c8[3] = 0.0;
        local_c8[0] = 0.0;
        local_c8[1] = 0.0;
        local_c8[8] = 0.0;
        lVar6 = 0;
        pdVar5 = local_78;
        do {
          lVar8 = 0;
          padVar3 = (double (*) [3])a;
          do {
            dVar12 = local_c8[lVar6 * 3 + lVar8];
            lVar10 = 0;
            padVar7 = padVar3;
            do {
              dVar12 = dVar12 + pdVar5[lVar10] *
                                (((SquareMatrix<double,_3> *)*padVar7)->
                                super_RectMatrix<double,_3U,_3U>).data_[0][0];
              lVar10 = lVar10 + 1;
              padVar7 = padVar7 + 1;
            } while (lVar10 != 3);
            local_c8[lVar6 * 3 + lVar8] = dVar12;
            lVar8 = lVar8 + 1;
            padVar3 = (double (*) [3])(*padVar3 + 1);
          } while (lVar8 != 3);
          lVar6 = lVar6 + 1;
          pdVar5 = pdVar5 + 3;
        } while (lVar6 != 3);
        (*(pAVar1->super_StuntDouble)._vptr_StuntDouble[2])(pAVar1,local_c8);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      ppAVar4 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->atoms_).
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar4 >> 3)
            );
  }
  return;
}

Assistant:

void RigidBody::setPrevA(const RotMat3x3d& a) {
    ((snapshotMan_->getPrevSnapshot())->*storage_).aMat[localIndex_] = a;

    for (unsigned int i = 0; i < atoms_.size(); ++i) {
      if (atoms_[i]->isDirectional()) {
        atoms_[i]->setPrevA(refOrients_[i].transpose() * a);
      }
    }
  }